

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.cpp
# Opt level: O0

void __thiscall mir::types::FunctionTy::display(FunctionTy *this,ostream *o)

{
  bool bVar1;
  ostream *val;
  ostream *in_RSI;
  __normal_iterator<const_std::shared_ptr<mir::types::Ty>_*,_std::vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>_>
  *in_RDI;
  const_iterator i;
  vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
  *in_stack_ffffffffffffffb8;
  ostream *in_stack_ffffffffffffffc0;
  __normal_iterator<const_std::shared_ptr<mir::types::Ty>_*,_std::vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>_>
  local_18;
  ostream *local_10;
  
  local_10 = in_RSI;
  std::operator<<(in_RSI,"Fn(");
  local_18._M_current =
       (shared_ptr<mir::types::Ty> *)
       std::
       vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>::
       begin(in_stack_ffffffffffffffb8);
  while( true ) {
    std::vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
    ::end(in_stack_ffffffffffffffb8);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::shared_ptr<mir::types::Ty>_*,_std::vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>_>
                        *)in_stack_ffffffffffffffc0,
                       (__normal_iterator<const_std::shared_ptr<mir::types::Ty>_*,_std::vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>_>
                        *)in_stack_ffffffffffffffb8);
    if (!bVar1) break;
    std::vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
    ::begin(in_stack_ffffffffffffffb8);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::shared_ptr<mir::types::Ty>_*,_std::vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>_>
                        *)in_stack_ffffffffffffffc0,
                       (__normal_iterator<const_std::shared_ptr<mir::types::Ty>_*,_std::vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>_>
                        *)in_stack_ffffffffffffffb8);
    if (bVar1) {
      std::operator<<(local_10,", ");
    }
    in_stack_ffffffffffffffc0 = local_10;
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<mir::types::Ty>_*,_std::vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>_>
    ::operator*(&local_18);
    std::__shared_ptr_access<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
              ((__shared_ptr_access<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_ffffffffffffffc0);
    prelude::operator<<(in_stack_ffffffffffffffc0,(Displayable *)in_stack_ffffffffffffffb8);
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<mir::types::Ty>_*,_std::vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>_>
    ::operator++(in_RDI,(int)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
  }
  val = std::operator<<(local_10,") -> ");
  std::__shared_ptr_access<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            ((__shared_ptr_access<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffffc0);
  prelude::operator<<(in_stack_ffffffffffffffc0,(Displayable *)val);
  return;
}

Assistant:

void FunctionTy::display(std::ostream& o) const {
  o << "Fn(";
  for (auto i = params.begin(); i != params.end(); i++) {
    if (i != params.begin()) o << ", ";
    o << **i;
  }
  o << ") -> " << *ret;
}